

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  iterator iVar2;
  _List_node_base *p_Var3;
  iterator DotToken;
  iterator local_38;
  
  local_38._M_node = (_List_node_base *)CONCAT71(in_register_00000001,in_AL);
  iVar2._M_node = ScopeStart->_M_node;
  do {
    while( true ) {
      if (iVar2._M_node == ScopeEnd->_M_node) {
        return;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iVar2._M_node[1]._M_prev,".");
      p_Var3 = iVar2._M_node;
      if (bVar1) break;
LAB_00330f33:
      iVar2._M_node = p_Var3->_M_next;
    }
    p_Var3 = (iVar2._M_node)->_M_next;
    if (p_Var3 == ScopeEnd->_M_node) {
      return;
    }
    local_38._M_node = iVar2._M_node;
    if (*(int *)&p_Var3[1]._M_next != 0x13b) goto LAB_00330f33;
    bVar1 = ProcessObjectMethod(this,&local_38,ScopeStart,ScopeEnd);
    iVar2._M_node = p_Var3;
    if (bVar1) {
      iVar2._M_node = local_38._M_node;
    }
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethods(const TokenListType::iterator& ScopeStart,
                                                                    const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        // Search for .identifier pattern

        if (Token->Literal == ".")
        {
            auto DotToken = Token;
            ++Token;
            if (Token == ScopeEnd)
                break;
            if (Token->Type == TokenType::Identifier)
            {
                if (ProcessObjectMethod(DotToken, ScopeStart, ScopeEnd))
                    Token = DotToken;
            }
            else
            {
                ++Token;
                continue;
            }
        }
        else
            ++Token;
    }
}